

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O3

void fill_string_pool(xmlChar **strings,char **seeds)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  long lVar7;
  xmlHashTablePtr hash;
  StringPool *pool;
  xmlChar **ppxVar8;
  StringPool *pool_00;
  uint uVar9;
  size_t sVar10;
  int extraout_EDX;
  uint uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  char **ppcVar16;
  undefined8 in_R9;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uStack_78;
  
  pxVar6 = (xmlChar *)*seeds;
  if (pxVar6 == (xmlChar *)0x0) {
    uVar17 = 0;
  }
  else {
    ppcVar16 = seeds;
    uVar17 = 0;
    do {
      uVar15 = uVar17;
      pxVar5 = (xmlChar *)xmlStrdup();
      strings[uVar15] = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        fill_string_pool_cold_1();
        goto LAB_0010329f;
      }
      pxVar6 = (xmlChar *)seeds[uVar15 + 1];
      uVar17 = uVar15 + 1;
    } while (pxVar6 != (xmlChar *)0x0);
    if (0x15f8e < uVar15) {
      if (0x1869e < uVar15) {
        return;
      }
      goto LAB_00103172;
    }
  }
  uVar17 = uVar17 & 0xffffffff;
  uVar9 = 0;
  iVar4 = 0;
  do {
    lVar13 = (long)iVar4;
    uVar15 = (ulong)uVar9;
    pxVar6 = (xmlChar *)xmlStrncatNew(strings[lVar13],strings[uVar15],0xffffffff);
    strings[uVar17] = pxVar6;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0010326c;
    iVar2 = xmlStrlen(pxVar6);
    if (0x1e < iVar2) goto LAB_00103271;
    bVar19 = 0x30 < iVar4;
    bVar1 = 0x30 < iVar4;
    iVar4 = iVar4 + 1;
    if (bVar1) {
      iVar4 = 0;
    }
    uVar9 = bVar19 + uVar9;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 90000);
  uVar17 = 90000;
LAB_00103172:
  uVar3 = 99999 - (int)uVar17;
  uVar9 = 499;
  if (uVar3 < 499) {
    uVar9 = uVar3;
  }
  lVar18 = 0;
  lVar13 = 0;
  uVar15 = 0;
  while( true ) {
    iVar4 = (int)uVar15;
    lVar7 = xmlStrncatNew(strings[iVar4],":",0xffffffff);
    *(long *)((long)strings + lVar18 + (uVar17 & 0xffffffff) * 8) = lVar7;
    if (lVar7 == 0) break;
    uVar3 = iVar4 + 1;
    if (0x15f8e < iVar4) {
      uVar3 = 0;
    }
    lVar13 = lVar13 + -1;
    lVar18 = lVar18 + 8;
    uVar15 = (ulong)uVar3;
    if (uVar9 * 8 + 8 == (int)lVar18) {
      lVar13 = (uVar17 & 0xffffffff) - lVar13;
      if (lVar13 - 1U < 99999) {
        iVar2 = 0;
        iVar4 = 0;
        do {
          pxVar6 = strings[(long)iVar4 + 90000];
          ppcVar16 = (char **)strings[iVar2];
          pxVar5 = (xmlChar *)xmlStrncatNew(pxVar6,ppcVar16,0xffffffff);
          strings[lVar13] = pxVar5;
          if (pxVar5 == (xmlChar *)0x0) {
LAB_0010329f:
            fill_string_pool_cold_2();
            if (extraout_EDX == 0) {
              uStack_78 = 0;
              hash = (xmlHashTablePtr)xmlHashCreate(0);
            }
            else {
              uStack_78 = xmlDictCreate();
              hash = (xmlHashTablePtr)xmlHashCreateDict(0);
            }
            pool = (StringPool *)(*_xmlMalloc)(0x30);
            pool->num_entries = (size_t)pxVar6;
            pool->num_keys = (size_t)ppcVar16;
            sVar14 = (long)ppcVar16 * (long)pxVar6;
            __n = sVar14 * 8;
            ppxVar8 = (xmlChar **)(*_xmlMalloc)(__n);
            pool->strings = ppxVar8;
            memset(ppxVar8,0,__n);
            pool->num_strings = sVar14;
            pool->index = 0;
            pool->id = '1';
            pool_00 = (StringPool *)(*_xmlMalloc)(0x30);
            pool_00->num_entries = (size_t)pxVar6;
            pool_00->num_keys = (size_t)ppcVar16;
            uVar20 = 0;
            ppxVar8 = (xmlChar **)(*_xmlMalloc)(__n);
            pool_00->strings = ppxVar8;
            memset(ppxVar8,0,__n);
            pool_00->num_strings = sVar14;
            pool_00->index = 0;
            pool_00->id = '2';
            if (sVar14 != 0) {
              uVar20 = 0;
              do {
                uVar9 = rng_state_0 * -0x61c88645;
                uVar11 = rng_state_0 * -0x3910c8a0;
                uVar3 = rng_state_1 ^ rng_state_0;
                rng_state_0 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
                rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
                iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar9 >> 0x1b | uVar11) * 5) % 0x32));
                if (iVar4 != 0) {
                  test_hash_cold_1();
                  uVar20 = 1;
                }
                uVar9 = rng_state_0 * -0x61c88645;
                uVar11 = rng_state_0 * -0x3910c8a0;
                uVar3 = rng_state_1 ^ rng_state_0;
                rng_state_0 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
                rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
                iVar4 = pool_bulk_insert(pool_00,hash,(ulong)(((uVar9 >> 0x1b | uVar11) * 5) % 100))
                ;
                if (iVar4 != 0) {
                  test_hash_cold_2();
                  uVar20 = 1;
                }
              } while (pool_00->index < pool_00->num_strings);
            }
            pool_00->index = 0;
            iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,1);
            if (iVar4 != 0) {
              test_hash_cold_3();
              uVar20 = 1;
            }
            pool_00->index = 0;
            uVar9 = rng_state_0;
            do {
              do {
                rng_state_0 = uVar9;
                if ((pool->num_strings <= pool->index) && (pool_00->num_strings <= pool_00->index))
                {
                  pool->index = 0;
                  iVar4 = pool_bulk_lookup(pool,hash,pool->num_entries,1);
                  if (iVar4 != 0) {
                    test_hash_cold_4();
                  }
                  pool_00->index = 0;
                  iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,0);
                  if (iVar4 != 0) {
                    test_hash_cold_5();
                  }
                  pool_free(pool);
                  pool_free(pool_00);
                  xmlHashFree(hash,0);
                  xmlDictFree(uStack_78);
                  return;
                }
                uVar9 = rng_state_0 * -0x61c88645;
                uVar11 = rng_state_0 * -0x3910c8a0;
                uVar3 = rng_state_1 ^ rng_state_0;
                rng_state_0 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
                rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
                iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar9 >> 0x1b | uVar11) * 5) % 0x32));
                if (iVar4 != 0) {
                  test_hash_cold_6();
                  uVar20 = 1;
                }
                uVar3 = rng_state_1 ^ rng_state_0;
                uVar9 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
                rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
                sVar14 = pool_00->num_strings;
                uVar17 = pool_00->index;
              } while ((sVar14 <= uVar17) ||
                      (uVar3 = ((rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 * -0x3910c8a0) * 5)
                               % 100, uVar3 == 0));
              sVar10 = pool_00->num_keys;
              uVar15 = 1;
              uVar11 = 0;
              rng_state_0 = uVar9;
              do {
                ppxVar8 = pool_00->strings;
                if (sVar10 == 3) {
                  iVar4 = xmlHashRemoveEntry3(hash,ppxVar8[uVar17],ppxVar8[uVar17 + 1],
                                              ppxVar8[uVar17 + 2],0,in_R9,uVar20);
LAB_001035f3:
                  uVar12 = -(uint)(iVar4 != 0) | uVar11;
                  sVar10 = pool_00->num_keys;
                  sVar14 = pool_00->num_strings;
                }
                else {
                  if (sVar10 == 2) {
                    iVar4 = xmlHashRemoveEntry2(hash,ppxVar8[uVar17],ppxVar8[uVar17 + 1],0);
                    goto LAB_001035f3;
                  }
                  uVar12 = 0xffffffff;
                  if (sVar10 == 1) {
                    iVar4 = xmlHashRemoveEntry(hash,ppxVar8[uVar17],0);
                    goto LAB_001035f3;
                  }
                }
                uVar17 = uVar17 + sVar10;
              } while ((uVar17 < sVar14) &&
                      (bVar19 = uVar15 < uVar3, uVar15 = uVar15 + 1, uVar11 = uVar12, bVar19));
              pool_00->index = uVar17;
              uVar9 = rng_state_0;
              if (uVar12 != 0) {
                test_hash_cold_7();
                uVar20 = 1;
                uVar9 = rng_state_0;
              }
            } while( true );
          }
          bVar19 = 0x1f2 < iVar4;
          iVar4 = iVar4 + 1;
          if (bVar19) {
            iVar4 = 0;
          }
          bVar19 = 0x15f8a < iVar2;
          iVar2 = iVar2 + 5;
          if (bVar19) {
            iVar2 = 0;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 100000);
      }
      return;
    }
  }
  fill_string_pool_cold_3();
LAB_0010326c:
  fill_string_pool_cold_4();
LAB_00103271:
  fprintf(_stderr,"### %s %s\n",strings[lVar13 + 90000],strings[uVar15]);
  abort();
}

Assistant:

static void
fill_string_pool(xmlChar **strings, const char **seeds) {
    int i, j, k;
    int start_ns = NB_STRINGS_MAX - NB_STRINGS_NS;

    /*
     * That's a bit nasty but the output is fine and it doesn't take hours
     * there is a small but sufficient number of duplicates, and we have
     * ":xxx" and full QNames in the last NB_STRINGS_NS values
     */
    for (i = 0; seeds[i] != NULL; i++) {
        strings[i] = xmlStrdup((const xmlChar *) seeds[i]);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
    }
    for (j = 0, k = 0; i < start_ns; i++) {
        strings[i] = xmlStrncatNew(strings[j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        if (xmlStrlen(strings[i]) > 30) {
            fprintf(stderr, "### %s %s\n", strings[start_ns+j], strings[k]);
            abort();
        }
        j++;
	if (j >= 50) {
	    j = 0;
	    k++;
	}
    }
    for (j = 0, k = 0; (j < NB_STRINGS_PREFIX) && (i < NB_STRINGS_MAX);
         i++, j++) {
        strings[i] = xmlStrncatNew(strings[k], (const xmlChar *) ":", -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        k += 1;
        if (k >= start_ns) k = 0;
    }
    for (j = 0, k = 0; i < NB_STRINGS_MAX; i++) {
        strings[i] = xmlStrncatNew(strings[start_ns+j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        j++;
        if (j >= NB_STRINGS_PREFIX) j = 0;
	k += 5;
        if (k >= start_ns) k = 0;
    }
}